

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_posix.cpp
# Opt level: O0

void __thiscall pstore::brokerface::fifo_path::~fifo_path(fifo_path *this)

{
  char *__name;
  bool bVar1;
  bool local_11;
  fifo_path *pfStack_10;
  bool expected;
  fifo_path *this_local;
  
  local_11 = true;
  pfStack_10 = this;
  bVar1 = std::atomic<bool>::compare_exchange_strong
                    (&this->needs_delete_,&local_11,false,memory_order_seq_cst);
  if (bVar1) {
    __name = (char *)std::__cxx11::string::c_str();
    unlink(__name);
  }
  std::function<void_(pstore::brokerface::fifo_path::operation)>::~function(&this->update_cb_);
  std::__cxx11::string::~string((string *)&this->path_);
  return;
}

Assistant:

fifo_path::~fifo_path () {
            bool expected = true;
            if (needs_delete_.compare_exchange_strong (expected, false)) {
                ::unlink (path_.c_str ());
            }
        }